

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_PlaySpawnSound
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  AActor *spawner;
  char *pcVar4;
  AActor *missile;
  bool bVar5;
  PClass *pPVar2;
  undefined4 extraout_var_00;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042fdd0;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042fdb7:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042fdd0:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f6,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  spawner = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (spawner == (AActor *)0x0) goto LAB_0042fd09;
    pPVar2 = (spawner->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(spawner->super_DThinker).super_DObject._vptr_DObject)(spawner);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (spawner->super_DThinker).super_DObject.Class = pPVar2;
    }
    bVar5 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar3 && bVar5) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar5 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar3) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042fdd0;
    }
  }
  else {
    if (spawner != (AActor *)0x0) goto LAB_0042fdb7;
LAB_0042fd09:
    spawner = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042fdf8;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0042fdc0:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042fdf8;
  }
  missile = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (missile == (AActor *)0x0) goto LAB_0042fd3a;
  }
  else {
    if (missile != (AActor *)0x0) goto LAB_0042fdc0;
LAB_0042fd3a:
    NullParam("\"missile\"");
    missile = (AActor *)param[1].field_0.field_1.a;
    if (missile == (AActor *)0x0) {
      missile = (AActor *)0x0;
      goto LAB_0042fda2;
    }
  }
  pPVar2 = AActor::RegistrationInfo.MyClass;
  pPVar3 = (missile->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar1 = (**(missile->super_DThinker).super_DObject._vptr_DObject)(missile);
    pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
    (missile->super_DThinker).super_DObject.Class = pPVar3;
  }
  bVar5 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar2 && bVar5) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar5 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar2) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar5) {
    pcVar4 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0042fdf8:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f7,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0042fda2:
  P_PlaySpawnSound(missile,spawner);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, PlaySpawnSound)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(missile, AActor);
	P_PlaySpawnSound(missile, self);
	return 0;
}